

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O3

void iniparser_dump(dictionary *d,FILE *f)

{
  long lVar1;
  
  if ((f != (FILE *)0x0 && d != (dictionary *)0x0) && (0 < d->size)) {
    lVar1 = 0;
    do {
      if (d->key[lVar1] != (char *)0x0) {
        if (d->val[lVar1] == (char *)0x0) {
          fprintf((FILE *)f,"[%s]=UNDEF\n");
        }
        else {
          fprintf((FILE *)f,"[%s]=[%s]\n");
        }
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < d->size);
  }
  return;
}

Assistant:

void iniparser_dump(const dictionary * d, FILE * f)
{
    int     i ;

    if (d==NULL || f==NULL) return ;
    for (i=0 ; i<d->size ; i++) {
        if (d->key[i]==NULL)
            continue ;
        if (d->val[i]!=NULL) {
            fprintf(f, "[%s]=[%s]\n", d->key[i], d->val[i]);
        } else {
            fprintf(f, "[%s]=UNDEF\n", d->key[i]);
        }
    }
    return ;
}